

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

FT_Error ps_table_realloc(PS_Table table,FT_Offset new_size)

{
  FT_Pointer pvVar1;
  FT_Byte **ppFVar2;
  FT_Byte **limit;
  FT_Byte **offset;
  FT_Byte *pFStack_30;
  FT_Error error;
  FT_Byte *old_base;
  FT_Memory memory;
  FT_Offset new_size_local;
  PS_Table table_local;
  
  old_base = (FT_Byte *)table->memory;
  pFStack_30 = table->block;
  memory = (FT_Memory)new_size;
  new_size_local = (FT_Offset)table;
  pvVar1 = ft_mem_realloc((FT_Memory)old_base,1,table->capacity,new_size,table->block,
                          (FT_Error *)((long)&offset + 4));
  *(FT_Pointer *)new_size_local = pvVar1;
  if (offset._4_4_ == 0) {
    if ((pFStack_30 != (FT_Byte *)0x0) && (*(FT_Byte **)new_size_local != pFStack_30)) {
      limit = *(FT_Byte ***)(new_size_local + 0x28);
      ppFVar2 = limit + *(int *)(new_size_local + 0x20);
      for (; limit < ppFVar2; limit = limit + 1) {
        if (*limit != (FT_Byte *)0x0) {
          *limit = *limit + (*(long *)new_size_local - (long)pFStack_30);
        }
      }
    }
    *(FT_Memory *)(new_size_local + 0x10) = memory;
    table_local._4_4_ = 0;
  }
  else {
    table_local._4_4_ = offset._4_4_;
  }
  return table_local._4_4_;
}

Assistant:

static FT_Error
  ps_table_realloc( PS_Table   table,
                    FT_Offset  new_size )
  {
    FT_Memory  memory   = table->memory;
    FT_Byte*   old_base = table->block;
    FT_Error   error;


    /* (re)allocate the base block */
    if ( FT_REALLOC( table->block, table->capacity, new_size ) )
      return error;

    /* rebase offsets if necessary */
    if ( old_base && table->block != old_base )
    {
      FT_Byte**   offset = table->elements;
      FT_Byte**   limit  = offset + table->max_elems;


      for ( ; offset < limit; offset++ )
      {
        if ( *offset )
          *offset = table->block + ( *offset - old_base );
      }
    }

    table->capacity = new_size;

    return FT_Err_Ok;
  }